

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdline_parser.cpp
# Opt level: O0

void __thiscall
tlx::CmdlineParser::add_bytes
          (CmdlineParser *this,char key,string *longkey,uint64_t *dest,string *desc)

{
  allocator local_51;
  string local_50;
  string *local_30;
  string *desc_local;
  uint64_t *dest_local;
  string *longkey_local;
  CmdlineParser *pCStack_10;
  char key_local;
  CmdlineParser *this_local;
  
  local_30 = desc;
  desc_local = (string *)dest;
  dest_local = (uint64_t *)longkey;
  longkey_local._7_1_ = key;
  pCStack_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_50,"",&local_51);
  add_bytes(this,key,longkey,&local_50,(uint64_t *)desc_local,local_30);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  return;
}

Assistant:

void CmdlineParser::add_bytes(char key, const std::string& longkey,
                              uint64_t& dest, const std::string& desc) {
    return add_bytes(key, longkey, "", dest, desc);
}